

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool>
 __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
::insert(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
         *this,value_type *entry)

{
  container *p_00;
  iterator after_me;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
  *in_RSI;
  value_type *in_RDI;
  pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool>
  pVar2;
  iterator p;
  range_type *range;
  pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool>
  r;
  basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
  *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  bool bVar3;
  container *this_00;
  value_type *v;
  container *in_stack_fffffffffffffff0;
  bool local_8;
  
  this_00 = (container *)0x0;
  bVar3 = false;
  v = in_RDI;
  std::
  pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool>
  ::
  pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool,_true>
            ((pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool>
              *)&stack0xfffffffffffffff0,(container **)&stack0xffffffffffffffd8,
             (bool *)&stack0xffffffffffffffd7);
  rehash_if_needed(in_stack_ffffffffffffffc0);
  p_00 = (container *)
         basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
         ::get<std::__cxx11::string>
                   (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00);
  after_me = basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
             ::find_in_range<std::__cxx11::string>
                       ((basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
                         *)this_00,(range_type *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_00);
  uVar1 = extraout_RDX;
  if (after_me == (iterator)0x0) {
    after_me = allocate((basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
                         *)in_stack_fffffffffffffff0,v);
    if ((p_00->val).first._M_string_length == 0) {
      intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
      ::push_back((intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
                   *)((long)&(in_RDI->first).field_2 + 8),after_me);
      (p_00->val).first._M_string_length = (size_type)after_me;
      *(iterator *)&(p_00->val).first = after_me;
      uVar1 = extraout_RDX_00;
    }
    else {
      intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
      ::insert_after((intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
                      *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),p_00,after_me);
      (p_00->val).first._M_string_length = (size_type)after_me;
      uVar1 = extraout_RDX_01;
    }
    local_8 = true;
    *(long *)&(in_RDI->second).info = *(long *)&(in_RDI->second).info + 1;
  }
  pVar2._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  pVar2.second = local_8;
  pVar2.first = after_me;
  return pVar2;
}

Assistant:

std::pair<iterator,bool> insert(value_type const &entry)
	{
		std::pair<iterator,bool> r(iterator(),false);
		rehash_if_needed();
		range_type &range=get(entry.first);
		iterator p = find_in_range(range,entry.first);
		if(p) {
			r.first = p;
			return r;
		}
		p = allocate(entry);
		if(range.second == 0) {
			list_.push_back(p);
			range.first = range.second = p;
		}
		else {
			list_.insert_after(p,range.second);
			range.second = p;
		}

		r.first = p;
		r.second  = true;
		size_ ++;
		return r;
	}